

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O1

void GenCodeCmdMovMult(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  if (cmd.rA == cmd.rC) {
    __assert_fail("cmd.rA != cmd.rC",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGenRegVm_X86.cpp"
                  ,0x4c9,"void GenCodeCmdMovMult(CodeGenRegVmContext &, RegVmCmd)");
  }
  GetCodeCmdMovHelper(ctx,cmd.rA,cmd.rC,cmd._2_4_ & rvcLong);
  if ((cmd.argument._2_2_ & 0xff) != (ushort)cmd.argument._3_1_) {
    GetCodeCmdMovHelper(ctx,cmd.argument._3_1_,cmd.argument._2_1_,
                        (RegVmCopyType)((ulong)cmd >> 0x12) & rvcLong);
  }
  if (cmd.argument._1_1_ != (uchar)cmd.argument) {
    GetCodeCmdMovHelper(ctx,cmd.argument._1_1_,(uchar)cmd.argument,
                        (RegVmCopyType)((ulong)cmd >> 0x14) & rvcLong);
    return;
  }
  return;
}

Assistant:

void GenCodeCmdMovMult(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	assert(cmd.rA != cmd.rC);

	{
		unsigned char rhs = cmd.rC;
		unsigned char lhs = cmd.rA;
		RegVmCopyType copyType = RegVmCopyType(cmd.rB & 0x3);

		GetCodeCmdMovHelper(ctx, lhs, rhs, copyType);
	}

	if(((cmd.argument >> 16) & 0xff) != (cmd.argument >> 24))
	{
		unsigned char rhs = ((cmd.argument >> 16) & 0xff);
		unsigned char lhs = (cmd.argument >> 24);
		RegVmCopyType copyType = RegVmCopyType((cmd.rB >> 2) & 0x3);

		GetCodeCmdMovHelper(ctx, lhs, rhs, copyType);
	}

	if((cmd.argument & 0xff) != ((cmd.argument >> 8) & 0xff))
	{
		unsigned char rhs = (cmd.argument & 0xff);
		unsigned char lhs = ((cmd.argument >> 8) & 0xff);
		RegVmCopyType copyType = RegVmCopyType((cmd.rB >> 4) & 0x3);

		GetCodeCmdMovHelper(ctx, lhs, rhs, copyType);
	}
}